

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_priority_deque.cpp
# Opt level: O2

bool (anonymous_namespace)::
     have_same_elements<boost::container::priority_deque<int,std::vector<int,std::allocator<int>>,std::less<int>>,int>
               (priority_deque<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>_> *values
               ,multiset<int,_std::less<int>,_std::allocator<int>_> *rf)

{
  iterator __position;
  pointer __k;
  
  __k = (values->sequence_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start;
  while( true ) {
    if (__k == (values->sequence_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish) {
      return (rf->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0;
    }
    __position = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                 ::find(&rf->_M_t,__k);
    if ((_Rb_tree_header *)__position._M_node == &(rf->_M_t)._M_impl.super__Rb_tree_header) break;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::erase_abi_cxx11_
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)rf,
               (const_iterator)__position._M_node);
    __k = __k + 1;
  }
  return false;
}

Assistant:

bool have_same_elements(T const & values, std::multiset<T2> rf)
{
  typedef typename T::const_iterator itr_t;
  for (itr_t it = values.begin(); it != values.end(); ++it)
  {
    typedef typename std::multiset<T2>::iterator set_itr_t;
    set_itr_t set_it = rf.find(*it);
    if (set_it == rf.end())
      return false;
    else
      rf.erase(set_it);
  }
  return rf.empty();
}